

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O0

Comparison
Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>::compare
          (UnresolvedSplitRecord *r1,UnresolvedSplitRecord *r2)

{
  bool bVar1;
  uint *in_RSI;
  uint *in_RDI;
  bool r2HasSpecVars;
  bool r1HasSpecVars;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined4 local_4;
  
  bVar1 = Kernel::TermList::isTerm((TermList *)0x3c0f9c);
  local_1b = 0;
  if (bVar1) {
    Kernel::TermList::term((TermList *)0x3c0fb9);
    bVar1 = Kernel::Term::shared((Term *)0x3c0fc1);
    local_1b = bVar1 ^ 0xff;
  }
  bVar1 = Kernel::TermList::isTerm((TermList *)0x3c0fdf);
  local_1c = 0;
  if (bVar1) {
    Kernel::TermList::term((TermList *)0x3c0ffc);
    bVar1 = Kernel::Term::shared((Term *)0x3c1004);
    local_1c = bVar1 ^ 0xff;
  }
  if (((local_1b & 1) == 0) || ((local_1c & 1) != 0)) {
    if (((local_1c & 1) == 0) || ((local_1b & 1) != 0)) {
      local_4 = Lib::Int::compare(*in_RSI,*in_RDI);
    }
    else {
      local_4 = LESS;
    }
  }
  else {
    local_4 = GREATER;
  }
  return local_4;
}

Assistant:

static Comparison compare(const UnresolvedSplitRecord& r1, const UnresolvedSplitRecord& r2)
  {
    bool r1HasSpecVars=r1.original.isTerm() && !r1.original.term()->shared();
    bool r2HasSpecVars=r2.original.isTerm() && !r2.original.term()->shared();
    if( r1HasSpecVars && !r2HasSpecVars ) {
      return GREATER;
    }
    if( r2HasSpecVars && !r1HasSpecVars ) {
      return LESS;
    }
    return Int::compare(r2.var,r1.var);
  }